

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

double __thiscall HyperLogLog::Assess(HyperLogLog *this)

{
  int local_38;
  int local_34;
  int j_1;
  int V;
  double E;
  double Z;
  double dStack_18;
  int j;
  double divider;
  HyperLogLog *this_local;
  
  dStack_18 = 0.0;
  for (Z._4_4_ = 0; Z._4_4_ < 0x10; Z._4_4_ = Z._4_4_ + 1) {
    dStack_18 = 1.0 / (double)(1 << (this->hllv[Z._4_4_] & 0x1f)) + dStack_18;
  }
  _j_1 = (1.0 / dStack_18) * 172.288;
  if (_j_1 < 40.0) {
    local_34 = 0;
    for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
      if (this->hllv[local_38] == '\0') {
        local_34 = local_34 + 1;
      }
    }
    if (0 < local_34) {
      _j_1 = log(16.0 / (double)local_34);
      _j_1 = _j_1 * 16.0;
    }
  }
  return _j_1;
}

Assistant:

double HyperLogLog::Assess()
{
    /*
    * First, compute the "indicator" of the m=16 registers
    * Z = 1 / sum (1 / 2^hll[j])
    * The indicator is NOT the same as the harmonic mean. The relation is:
    * harmonic_mean = m * Z
    */
    double divider = 0;
    for (int j = 0; j < 16; j++) {
        divider += 1.0 / ((double)(1 << hllv[j]));
    }
    double Z = 1.0 / divider;

    /*
    * Then, compute E using a precomputed coefficient to correct the bias of the formula
    * E = alpha_m * (m^2) * Z
    * For m = 16, use the precomputed value alpha_m = 0.673
    * 0.673 * (16^2) = 0.673*256 = 172.288
     */
    double E = Z * 172.288;

    /*
    * For small values (E < (5/2)*m , use Linear counting
    */
    if (E < 40.0) {
        int V = 0;
        for (int j = 0; j < 16; j++) {
            if (hllv[j] == 0) {
                V += 1;
            }
        }
        if (V > 0) {
            E = 16 * log(16.0 / (double)V);
        }
    }

    return E;
}